

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

bool Rml::BuildToken(String *token,char **token_begin,char *string_end,bool first_token,
                    bool collapse_white_space,bool break_at_endline,
                    TextTransform text_transformation,bool decode_escape_characters)

{
  char *__end;
  code *pcVar1;
  bool bVar2;
  char *__beg;
  bool local_b6;
  bool white_space;
  allocator<char> local_59;
  undefined1 local_58 [8];
  String escape_code;
  char *escape_begin;
  char character;
  bool force_non_whitespace;
  bool parsing_white_space;
  bool decode_escape_characters_local;
  bool break_at_endline_local;
  bool collapse_white_space_local;
  bool first_token_local;
  char *string_end_local;
  char **token_begin_local;
  String *token_local;
  
  if ((*token_begin == string_end) &&
     (bVar2 = Assert("RMLUI_ASSERT(token_begin != string_end)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0x1fd), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)token);
  escape_begin._3_1_ = StringUtilities::IsWhitespace(**token_begin);
  do {
    if (*token_begin == string_end) {
      return false;
    }
    escape_begin._2_1_ = false;
    escape_begin._1_1_ = **token_begin;
    escape_code.field_2._8_8_ = *token_begin;
    if ((decode_escape_characters) && (escape_begin._1_1_ == '&')) {
      while( true ) {
        bVar2 = false;
        if (*token_begin != string_end) {
          bVar2 = **token_begin != ';';
        }
        if (!bVar2) break;
        *token_begin = *token_begin + 1;
      }
      if (*token_begin == string_end) {
        *token_begin = (char *)escape_code.field_2._8_8_;
      }
      else {
        __beg = (char *)(escape_code.field_2._8_8_ + 1);
        __end = *token_begin;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<char_const*,void>((string *)local_58,__beg,__end,&local_59);
        ::std::allocator<char>::~allocator(&local_59);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,"lt");
        if (bVar2) {
          escape_begin._1_1_ = '<';
        }
        else {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_58,"gt");
          if (bVar2) {
            escape_begin._1_1_ = '>';
          }
          else {
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_58,"amp");
            if (bVar2) {
              escape_begin._1_1_ = '&';
            }
            else {
              bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_58,"quot");
              if (bVar2) {
                escape_begin._1_1_ = '\"';
              }
              else {
                escape_begin._2_1_ =
                     ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_58,"nbsp");
                if (escape_begin._2_1_) {
                  escape_begin._1_1_ = ' ';
                }
                else {
                  *token_begin = (char *)escape_code.field_2._8_8_;
                }
              }
            }
          }
        }
        ::std::__cxx11::string::~string((string *)local_58);
      }
    }
    if ((break_at_endline) && (escape_begin._1_1_ == '\n')) {
      ::std::__cxx11::string::operator+=((string *)token,'\n');
      *token_begin = *token_begin + 1;
      return true;
    }
    local_b6 = false;
    if (escape_begin._2_1_ == false) {
      local_b6 = StringUtilities::IsWhitespace(escape_begin._1_1_);
    }
    if (local_b6 != escape_begin._3_1_) {
      if (!collapse_white_space) {
        *token_begin = (char *)escape_code.field_2._8_8_;
        return false;
      }
      if (escape_begin._3_1_ == false) {
        if ((*token_begin != string_end) &&
           (bVar2 = LastToken(*token_begin,string_end,collapse_white_space,break_at_endline), bVar2)
           ) {
          ::std::__cxx11::string::operator+=((string *)token,' ');
        }
        return false;
      }
      if (!first_token) {
        ::std::__cxx11::string::operator+=((string *)token,' ');
      }
      escape_begin._3_1_ = false;
    }
    if (local_b6 == false) {
      if (text_transformation == Uppercase) {
        if (('`' < escape_begin._1_1_) && (escape_begin._1_1_ < '{')) {
          escape_begin._1_1_ = escape_begin._1_1_ + -0x20;
        }
      }
      else if (((text_transformation == Lowercase) && ('@' < escape_begin._1_1_)) &&
              (escape_begin._1_1_ < '[')) {
        escape_begin._1_1_ = escape_begin._1_1_ + ' ';
      }
      ::std::__cxx11::string::operator+=((string *)token,escape_begin._1_1_);
    }
    else if (!collapse_white_space) {
      ::std::__cxx11::string::operator+=((string *)token,' ');
    }
    *token_begin = *token_begin + 1;
  } while( true );
}

Assistant:

static bool BuildToken(String& token, const char*& token_begin, const char* string_end, bool first_token, bool collapse_white_space,
	bool break_at_endline, Style::TextTransform text_transformation, bool decode_escape_characters)
{
	RMLUI_ASSERT(token_begin != string_end);

	token.reserve(string_end - token_begin + token.size());

	// Check what the first character of the token is; all we need to know is if it is white-space or not.
	bool parsing_white_space = StringUtilities::IsWhitespace(*token_begin);

	// Loop through the string from the token's beginning until we find an end to the token. This can occur in various
	// places, depending on the white-space processing;
	//  - at the end of a section of non-white-space characters,
	//  - at the end of a section of white-space characters, if we're not collapsing white-space,
	//  - at an endline token, if we're breaking on endlines.
	while (token_begin != string_end)
	{
		bool force_non_whitespace = false;
		char character = *token_begin;

		const char* escape_begin = token_begin;

		// Check for an ampersand; if we find one, we've got an HTML escaped character.
		if (decode_escape_characters && character == '&')
		{
			// Find the terminating ';'.
			while (token_begin != string_end && *token_begin != ';')
				++token_begin;

			// If we couldn't find the ';', print the token like normal text.
			if (token_begin == string_end)
			{
				token_begin = escape_begin;
			}
			// We could find a ';', parse the escape code. If the escape code is recognised, set the parsed character
			// to the appropriate one. If it is a non-breaking space, prevent it being picked up as whitespace. If it
			// is not recognised, print the token like normal text.
			else
			{
				String escape_code(escape_begin + 1, token_begin);

				if (escape_code == "lt")
					character = '<';
				else if (escape_code == "gt")
					character = '>';
				else if (escape_code == "amp")
					character = '&';
				else if (escape_code == "quot")
					character = '"';
				else if (escape_code == "nbsp")
				{
					character = ' ';
					force_non_whitespace = true;
				}
				else
					token_begin = escape_begin;
			}
		}

		// Check for an endline token; if we're breaking on endlines and we find one, then return true to indicate a
		// forced break.
		if (break_at_endline && character == '\n')
		{
			token += '\n';
			token_begin++;
			return true;
		}

		// If we've transitioned from white-space characters to non-white-space characters, or vice-versa, then check
		// if should terminate the token; if we're not collapsing white-space, then yes (as sections of white-space are
		// non-breaking), otherwise only if we've transitioned from characters to white-space.
		bool white_space = !force_non_whitespace && StringUtilities::IsWhitespace(character);
		if (white_space != parsing_white_space)
		{
			if (!collapse_white_space)
			{
				// Restore pointer to the beginning of the escaped token, if we processed an escape code.
				token_begin = escape_begin;
				return false;
			}

			// We're collapsing white-space; we only tokenise words, not white-space, so we're only done tokenising
			// once we've begun parsing non-white-space and then found white-space.
			if (!parsing_white_space)
			{
				// However, if we are the last non-whitespace character in the string, and there are trailing
				// whitespace characters after this token, then we need to append a single space to the end of this
				// token.
				if (token_begin != string_end && LastToken(token_begin, string_end, collapse_white_space, break_at_endline))
					token += ' ';

				return false;
			}

			// We've transitioned from white-space to non-white-space, so we append a single white-space character.
			if (!first_token)
				token += ' ';

			parsing_white_space = false;
		}

		// If the current character is white-space, we'll append a space character to the token if we're not collapsing
		// sections of white-space.
		if (white_space)
		{
			if (!collapse_white_space)
				token += ' ';
		}
		else
		{
			if (text_transformation == Style::TextTransform::Uppercase)
			{
				if (character >= 'a' && character <= 'z')
					character += ('A' - 'a');
			}
			else if (text_transformation == Style::TextTransform::Lowercase)
			{
				if (character >= 'A' && character <= 'Z')
					character -= ('A' - 'a');
			}

			token += character;
		}

		++token_begin;
	}

	return false;
}